

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double recfact(double N)

{
  double dVar1;
  double i;
  double N_local;
  
  if (((double)(int)N != 1.0) || (NAN((double)(int)N))) {
    dVar1 = recfact(N - 1.0);
    N_local = N * dVar1;
  }
  else {
    N_local = 1.0;
  }
  return N_local;
}

Assistant:

double recfact(double N) {
	double i;

	i = (int) N;

	if (i == 1) {
		return 1;
	} else {
		return N * recfact(N-1);
	}

}